

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O1

void __thiscall
Assimp::STEP::InternGenericConvertList<Assimp::STEP::EXPRESS::DataType,_1UL,_2UL>::operator()
          (InternGenericConvertList<Assimp::STEP::EXPRESS::DataType,_1UL,_2UL> *this,
          ListOf<Assimp::STEP::EXPRESS::DataType,_1UL,_2UL> *out,
          shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *inp_base,DB *db)

{
  element_type *peVar1;
  pointer psVar2;
  long lVar3;
  Logger *this_00;
  TypeError *this_01;
  ulong uVar4;
  long lVar5;
  char *message;
  string local_58;
  
  peVar1 = (inp_base->
           super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  if (peVar1 == (element_type *)0x0) {
    lVar3 = 0;
  }
  else {
    lVar3 = __dynamic_cast(peVar1,&EXPRESS::DataType::typeinfo,&EXPRESS::LIST::typeinfo,0);
  }
  if (lVar3 == 0) {
    this_01 = (TypeError *)__cxa_allocate_exception(0x10);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"type error reading aggregate","");
    TypeError::TypeError(this_01,&local_58,0xffffffffffffffff,0xffffffffffffffff);
    __cxa_throw(this_01,&TypeError::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((ulong)(*(long *)(lVar3 + 0x10) - *(long *)(lVar3 + 8)) < 0x21) {
    if (*(long *)(lVar3 + 0x10) != *(long *)(lVar3 + 8)) goto LAB_005a5000;
    message = "too few aggregate elements";
  }
  else {
    message = "too many aggregate elements";
  }
  this_00 = DefaultLogger::get();
  Logger::warn(this_00,message);
LAB_005a5000:
  std::
  vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
  ::reserve(&out->
             super_vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
            ,*(long *)(lVar3 + 0x10) - *(long *)(lVar3 + 8) >> 4);
  if (*(long *)(lVar3 + 0x10) != *(long *)(lVar3 + 8)) {
    lVar5 = 8;
    uVar4 = 0;
    do {
      local_58._M_dataplus._M_p = (pointer)0x0;
      local_58._M_string_length = 0;
      std::
      vector<std::shared_ptr<Assimp::STEP::EXPRESS::DataType_const>,std::allocator<std::shared_ptr<Assimp::STEP::EXPRESS::DataType_const>>>
      ::emplace_back<std::shared_ptr<Assimp::STEP::EXPRESS::DataType_const>>
                ((vector<std::shared_ptr<Assimp::STEP::EXPRESS::DataType_const>,std::allocator<std::shared_ptr<Assimp::STEP::EXPRESS::DataType_const>>>
                  *)out,(shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)&local_58);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length);
      }
      psVar2 = (out->
               super_vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
               ).
               super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_58._M_dataplus._M_p = *(pointer *)(*(long *)(lVar3 + 8) + -8 + lVar5);
      local_58._M_string_length = *(long *)(*(long *)(lVar3 + 8) + lVar5);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length)->_M_use_count
               = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length)->
                 _M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length)->_M_use_count
               = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length)->
                 _M_use_count + 1;
        }
      }
      psVar2[-1].
      super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_58._M_dataplus._M_p;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&psVar2[-1].
                  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,
                 (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_58._M_string_length);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length);
      }
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 0x10;
    } while (uVar4 < (ulong)(*(long *)(lVar3 + 0x10) - *(long *)(lVar3 + 8) >> 4));
  }
  return;
}

Assistant:

void operator()(ListOf<T, min_cnt, max_cnt>& out, const std::shared_ptr< const EXPRESS::DataType >& inp_base, const STEP::DB& db) {

            const EXPRESS::LIST* inp = dynamic_cast<const EXPRESS::LIST*>(inp_base.get());
            if (!inp) {
                throw TypeError("type error reading aggregate");
            }

            // XXX is this really how the EXPRESS notation ([?:3],[1:3]) is intended?
            if (max_cnt && inp->GetSize() > max_cnt) {
                ASSIMP_LOG_WARN("too many aggregate elements");
            }
            else if (inp->GetSize() < min_cnt) {
                ASSIMP_LOG_WARN("too few aggregate elements");
            }

            out.reserve(inp->GetSize());
            for(size_t i = 0; i < inp->GetSize(); ++i) {

                out.push_back( typename ListOf<T, min_cnt, max_cnt>::OutScalar() );
                try{
                    GenericConvert(out.back(),(*inp)[i], db);
                }
                catch(const TypeError& t) {
                    throw TypeError(t.what() +std::string(" of aggregate"));
                }
            }
        }